

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O3

void __thiscall cmQtAutoGenGlobalInitializer::Keywords::Keywords(Keywords *this)

{
  (this->AUTOMOC)._M_dataplus._M_p = (pointer)&(this->AUTOMOC).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"AUTOMOC","");
  (this->AUTOUIC)._M_dataplus._M_p = (pointer)&(this->AUTOUIC).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->AUTOUIC,"AUTOUIC","");
  (this->AUTORCC)._M_dataplus._M_p = (pointer)&(this->AUTORCC).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->AUTORCC,"AUTORCC","");
  (this->AUTOMOC_EXECUTABLE)._M_dataplus._M_p = (pointer)&(this->AUTOMOC_EXECUTABLE).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->AUTOMOC_EXECUTABLE,"AUTOMOC_EXECUTABLE","");
  (this->AUTOUIC_EXECUTABLE)._M_dataplus._M_p = (pointer)&(this->AUTOUIC_EXECUTABLE).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->AUTOUIC_EXECUTABLE,"AUTOUIC_EXECUTABLE","");
  (this->AUTORCC_EXECUTABLE)._M_dataplus._M_p = (pointer)&(this->AUTORCC_EXECUTABLE).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->AUTORCC_EXECUTABLE,"AUTORCC_EXECUTABLE","");
  (this->SKIP_AUTOGEN)._M_dataplus._M_p = (pointer)&(this->SKIP_AUTOGEN).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->SKIP_AUTOGEN,"SKIP_AUTOGEN","");
  (this->SKIP_AUTOMOC)._M_dataplus._M_p = (pointer)&(this->SKIP_AUTOMOC).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->SKIP_AUTOMOC,"SKIP_AUTOMOC","");
  (this->SKIP_AUTOUIC)._M_dataplus._M_p = (pointer)&(this->SKIP_AUTOUIC).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->SKIP_AUTOUIC,"SKIP_AUTOUIC","");
  (this->SKIP_AUTORCC)._M_dataplus._M_p = (pointer)&(this->SKIP_AUTORCC).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->SKIP_AUTORCC,"SKIP_AUTORCC","");
  (this->AUTOUIC_OPTIONS)._M_dataplus._M_p = (pointer)&(this->AUTOUIC_OPTIONS).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->AUTOUIC_OPTIONS,"AUTOUIC_OPTIONS","");
  (this->AUTORCC_OPTIONS)._M_dataplus._M_p = (pointer)&(this->AUTORCC_OPTIONS).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->AUTORCC_OPTIONS,"AUTORCC_OPTIONS","");
  (this->qrc)._M_dataplus._M_p = (pointer)&(this->qrc).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->qrc,"qrc","");
  (this->ui)._M_dataplus._M_p = (pointer)&(this->ui).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->ui,"ui","");
  return;
}

Assistant:

cmQtAutoGenGlobalInitializer::Keywords::Keywords()
  : AUTOMOC("AUTOMOC")
  , AUTOUIC("AUTOUIC")
  , AUTORCC("AUTORCC")
  , AUTOMOC_EXECUTABLE("AUTOMOC_EXECUTABLE")
  , AUTOUIC_EXECUTABLE("AUTOUIC_EXECUTABLE")
  , AUTORCC_EXECUTABLE("AUTORCC_EXECUTABLE")
  , SKIP_AUTOGEN("SKIP_AUTOGEN")
  , SKIP_AUTOMOC("SKIP_AUTOMOC")
  , SKIP_AUTOUIC("SKIP_AUTOUIC")
  , SKIP_AUTORCC("SKIP_AUTORCC")
  , AUTOUIC_OPTIONS("AUTOUIC_OPTIONS")
  , AUTORCC_OPTIONS("AUTORCC_OPTIONS")
  , qrc("qrc")
  , ui("ui")
{
}